

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O3

int sp_zgemv(char *trans,doublecomplex alpha,SuperMatrix *A,doublecomplex *x,int incx,
            doublecomplex beta,doublecomplex *y,int incy)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  int *piVar6;
  uint uVar7;
  double dVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  doublecomplex *pdVar12;
  undefined8 uVar13;
  long lVar14;
  double *pdVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  char msg [256];
  int local_138 [66];
  
  dVar23 = beta.i;
  dVar25 = beta.r;
  dVar22 = alpha.i;
  dVar21 = alpha.r;
  bVar10 = *trans + 0xbd;
  if ((bVar10 < 0x2c) && ((0x80000020801U >> ((ulong)bVar10 & 0x3f) & 1) != 0)) {
    uVar20 = 0xffffffdfffe >> (bVar10 & 0x3f);
    uVar9 = A->nrow;
    if (-1 < (int)uVar9) {
      uVar2 = A->ncol;
      lVar17 = (long)(int)uVar2;
      if (-1 < lVar17) {
        if (incx == 0) {
          local_138[0] = 5;
        }
        else {
          if (incy != 0) {
            if (uVar2 == 0 || uVar9 == 0) {
              return 0;
            }
            pvVar4 = A->Store;
            lVar5 = *(long *)((long)pvVar4 + 8);
            if ((((dVar21 == 0.0 && dVar22 == 0.0) && (dVar25 == 1.0)) && (!NAN(dVar25))) &&
               ((dVar23 == 0.0 && (!NAN(dVar23))))) {
              return 0;
            }
            uVar7 = uVar2;
            if ((uVar20 & 1) == 0) {
              uVar7 = uVar9;
              uVar9 = uVar2;
            }
            uVar2 = (1 - uVar7) * incx;
            if (0 < incx) {
              uVar2 = 0;
            }
            uVar19 = (ulong)uVar2;
            uVar2 = (1 - uVar9) * incy;
            if (0 < incy) {
              uVar2 = 0;
            }
            if (((dVar25 != 1.0) || (NAN(dVar25))) || ((dVar23 != 0.0 || (NAN(dVar23))))) {
              if (incy == 1) {
                if (dVar25 != 0.0 || dVar23 != 0.0) {
                  lVar11 = 0;
                  do {
                    dVar24 = *(double *)((long)&y->r + lVar11);
                    dVar1 = *(double *)((long)&y->i + lVar11);
                    pdVar15 = (double *)((long)&y->r + lVar11);
                    *pdVar15 = dVar24 * dVar25 + -dVar1 * dVar23;
                    pdVar15[1] = dVar24 * dVar23 + dVar1 * dVar25;
                    lVar11 = lVar11 + 0x10;
                  } while ((ulong)uVar9 << 4 != lVar11);
                }
                else {
                  memset(y,0,(ulong)uVar9 << 4);
                }
              }
              else if (dVar25 != 0.0 || dVar23 != 0.0) {
                pdVar12 = y + (int)uVar2;
                do {
                  dVar24 = pdVar12->r;
                  pdVar12->r = dVar24 * dVar25 + -pdVar12->i * dVar23;
                  pdVar12->i = dVar24 * dVar23 + pdVar12->i * dVar25;
                  pdVar12 = pdVar12 + incy;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
              else {
                pdVar12 = y + (int)uVar2;
                do {
                  pdVar12->r = 0.0;
                  pdVar12->i = 0.0;
                  pdVar12 = pdVar12 + incy;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
            }
            if (dVar21 == 0.0 && dVar22 == 0.0) {
              return 0;
            }
            if ((uVar20 & 1) == 0) {
              if ((byte)(*trans | 0x20U) == 0x74) {
                if (incx == 1) {
                  piVar6 = *(int **)((long)pvVar4 + 0x18);
                  lVar11 = (long)(int)uVar2;
                  lVar14 = 0;
                  iVar16 = *piVar6;
                  do {
                    iVar3 = piVar6[lVar14 + 1];
                    dVar25 = 0.0;
                    dVar23 = 0.0;
                    if (iVar16 < iVar3) {
                      lVar18 = (long)iVar16;
                      pdVar15 = (double *)(lVar18 * 0x10 + lVar5);
                      do {
                        iVar16 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar18 * 4);
                        dVar25 = dVar25 + x[iVar16].r * *pdVar15 + -pdVar15[1] * x[iVar16].i;
                        dVar23 = dVar23 + x[iVar16].r * pdVar15[1] + *pdVar15 * x[iVar16].i;
                        lVar18 = lVar18 + 1;
                        pdVar15 = pdVar15 + 2;
                      } while (iVar3 != lVar18);
                    }
                    lVar14 = lVar14 + 1;
                    y[lVar11].r = y[lVar11].r + dVar25 * dVar21 + -dVar23 * dVar22;
                    y[lVar11].i = y[lVar11].i + dVar25 * dVar22 + dVar23 * dVar21;
                    lVar11 = lVar11 + incy;
                    iVar16 = iVar3;
                  } while (lVar14 != lVar17);
                  return 0;
                }
                uVar13 = 0x23d;
              }
              else {
                if (incx == 1) {
                  piVar6 = *(int **)((long)pvVar4 + 0x18);
                  lVar11 = (long)(int)uVar2;
                  lVar14 = 0;
                  iVar16 = *piVar6;
                  do {
                    iVar3 = piVar6[lVar14 + 1];
                    dVar25 = 0.0;
                    dVar23 = 0.0;
                    if (iVar16 < iVar3) {
                      lVar18 = (long)iVar16;
                      pdVar15 = (double *)(lVar18 * 0x10 + lVar5);
                      do {
                        iVar16 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar18 * 4);
                        dVar25 = dVar25 + x[iVar16].r * -pdVar15[1] + x[iVar16].i * *pdVar15;
                        dVar23 = dVar23 + x[iVar16].r * *pdVar15 + x[iVar16].i * pdVar15[1];
                        lVar18 = lVar18 + 1;
                        pdVar15 = pdVar15 + 2;
                      } while (iVar3 != lVar18);
                    }
                    lVar14 = lVar14 + 1;
                    y[lVar11].r = y[lVar11].r + dVar23 * dVar21 + -dVar25 * dVar22;
                    y[lVar11].i = y[lVar11].i + dVar23 * dVar22 + dVar25 * dVar21;
                    lVar11 = lVar11 + incy;
                    iVar16 = iVar3;
                  } while (lVar14 != lVar17);
                  return 0;
                }
                uVar13 = 0x252;
              }
            }
            else {
              if (incy == 1) {
                lVar11 = 0;
                do {
                  dVar25 = x[uVar19].r;
                  dVar23 = x[uVar19].i;
                  if ((((dVar25 != 0.0) || (NAN(dVar25))) || (dVar23 != 0.0)) || (NAN(dVar23))) {
                    iVar16 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar11 * 4);
                    lVar14 = (long)iVar16;
                    iVar3 = *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar11 * 4);
                    if (iVar16 < iVar3) {
                      dVar24 = dVar25 * dVar21 + -dVar23 * dVar22;
                      dVar25 = dVar25 * dVar22 + dVar23 * dVar21;
                      lVar18 = *(long *)((long)pvVar4 + 0x10);
                      pdVar15 = (double *)(lVar14 * 0x10 + lVar5 + 8);
                      do {
                        iVar16 = *(int *)(lVar18 + lVar14 * 4);
                        dVar23 = pdVar15[-1];
                        dVar1 = *pdVar15;
                        dVar8 = y[iVar16].i;
                        y[iVar16].r = y[iVar16].r + dVar23 * dVar24 + dVar1 * -dVar25;
                        y[iVar16].i = dVar8 + dVar23 * dVar25 + dVar1 * dVar24;
                        lVar14 = lVar14 + 1;
                        pdVar15 = pdVar15 + 2;
                      } while (iVar3 != lVar14);
                    }
                  }
                  uVar19 = uVar19 + (long)incx;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar17);
                return 0;
              }
              uVar13 = 0x22b;
            }
            sprintf((char *)local_138,"%s at line %d in file %s\n","Not implemented.",uVar13,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
                   );
            superlu_abort_and_exit((char *)local_138);
            return 0;
          }
          local_138[0] = 8;
        }
        goto LAB_00104fc5;
      }
    }
    local_138[0] = 3;
  }
  else {
    local_138[0] = 1;
  }
LAB_00104fc5:
  input_error("sp_zgemv ",local_138);
  return 0;
}

Assistant:

int
sp_zgemv(char *trans, doublecomplex alpha, SuperMatrix *A, doublecomplex *x, 
	 int incx, doublecomplex beta, doublecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int info;
    doublecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    doublecomplex comp_zero = {0.0, 0.0};
    doublecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_zgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (z_eq(&alpha, &comp_zero) && z_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !z_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  zz_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    zz_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( z_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !z_eq(&x[jx], &comp_zero) ) {
		    zz_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			zz_mult(&temp1, &temp,  &Aval[i]);
			z_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    zz_mult(&temp1, &Aval[i], &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	doublecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    zz_mult(&temp1, &temp2, &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}